

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_SpawnBlood
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  char *pcVar2;
  AActor *originator;
  DAngle local_38;
  DVector3 local_30;
  
  if (numparam < 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_00432c70;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    originator = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (originator != (AActor *)0x0) {
        bVar1 = DObject::IsKindOf((DObject *)originator,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          pcVar2 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00432c70;
        }
        goto LAB_00432bbd;
      }
    }
    else if (originator != (AActor *)0x0) goto LAB_00432c60;
    originator = (AActor *)0x0;
LAB_00432bbd:
    if (numparam == 1) {
      pcVar2 = "(paramnum) < numparam";
    }
    else {
      if (param[1].field_0.field_3.Type == '\x01') {
        if ((uint)numparam < 3) {
          pcVar2 = "(paramnum) < numparam";
        }
        else {
          if (param[2].field_0.field_3.Type == '\x01') {
            if (numparam == 3) {
              pcVar2 = "(paramnum) < numparam";
            }
            else {
              if (param[3].field_0.field_3.Type == '\x01') {
                if ((uint)numparam < 5) {
                  pcVar2 = "(paramnum) < numparam";
                }
                else {
                  if (param[4].field_0.field_3.Type == '\x01') {
                    if (numparam == 5) {
                      pcVar2 = "(paramnum) < numparam";
                    }
                    else {
                      if (param[5].field_0.field_3.Type == '\0') {
                        local_30.X = (double)param[1].field_0.field_1.a;
                        local_30.Y = (double)param[2].field_0.field_1.a;
                        local_30.Z = (double)param[3].field_0.field_1.a;
                        local_38.Degrees = (double)param[4].field_0.field_1.a;
                        P_SpawnBlood(&local_30,&local_38,param[5].field_0.i,originator);
                        return 0;
                      }
                      pcVar2 = "param[paramnum].Type == REGT_INT";
                    }
                    __assert_fail(pcVar2,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                                  ,0x16d7,
                                  "int AF_AActor_SpawnBlood(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                 );
                  }
                  pcVar2 = "param[paramnum].Type == REGT_FLOAT";
                }
                __assert_fail(pcVar2,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                              ,0x16d6,
                              "int AF_AActor_SpawnBlood(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              pcVar2 = "param[paramnum].Type == REGT_FLOAT";
            }
            __assert_fail(pcVar2,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                          ,0x16d5,
                          "int AF_AActor_SpawnBlood(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pcVar2 = "param[paramnum].Type == REGT_FLOAT";
        }
        __assert_fail(pcVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x16d4,
                      "int AF_AActor_SpawnBlood(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pcVar2 = "param[paramnum].Type == REGT_FLOAT";
    }
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x16d3,
                  "int AF_AActor_SpawnBlood(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_00432c60:
  pcVar2 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00432c70:
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x16d2,
                "int AF_AActor_SpawnBlood(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SpawnBlood)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_FLOAT(z);
	PARAM_ANGLE(dir);
	PARAM_INT(damage);
	P_SpawnBlood(DVector3(x, y, z), dir, damage, self);
	return 0;
}